

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O3

string * trimStars(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  pointer pcVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __n;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + input->_M_string_length);
  __n = __return_storage_ptr__->_M_string_length;
  if (__n == 0) {
    uVar4 = 0xffffffffffffffff;
    goto LAB_0012b5a3;
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pvVar3 = memchr(pcVar2,0x2a,__n);
  uVar4 = (long)pvVar3 - (long)pcVar2;
  do {
    uVar4 = -(ulong)(pvVar3 == (void *)0x0) | uVar4;
LAB_0012b5a3:
    do {
      if (uVar4 == 0) {
LAB_0012b5c5:
        if (((uVar4 < __n - 1) &&
            (cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar4 + 1], cVar1 != ' ')) &&
           (cVar1 != '*')) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                    (__return_storage_ptr__,uVar4 + 1,1,' ');
        }
      }
      else {
        if (uVar4 == 0xffffffffffffffff) {
          return __return_storage_ptr__;
        }
        cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar4 - 1];
        if ((cVar1 == ' ') || (cVar1 == '*')) goto LAB_0012b5c5;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (__return_storage_ptr__,uVar4,1,' ');
        uVar4 = uVar4 + 1;
      }
      uVar5 = uVar4 + 1;
      __n = __return_storage_ptr__->_M_string_length;
      uVar4 = 0xffffffffffffffff;
    } while (__n < uVar5 || __n - uVar5 == 0);
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pvVar3 = memchr(pcVar2 + uVar5,0x2a,__n - uVar5);
    uVar4 = (long)pvVar3 - (long)pcVar2;
  } while( true );
}

Assistant:

inline std::string trimStars( std::string const & input )
{
  std::string result = input;
  size_t      pos    = result.find( '*' );
  while ( pos != std::string::npos )
  {
    if ( ( 0 < pos ) && ( result[pos - 1] != ' ' ) && ( result[pos - 1] != '*' ) )
    {
      result.insert( pos, 1, ' ' );
      ++pos;
    }
    else if ( ( pos < result.length() - 1 ) && ( result[pos + 1] != ' ' ) && ( result[pos + 1] != '*' ) )
    {
      result.insert( pos + 1, 1, ' ' );
    }
    pos = result.find( '*', pos + 1 );
  }
  return result;
}